

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

Name getMemoryName(BinaryenModuleRef module,char *memoryName)

{
  pointer puVar1;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var2;
  IString IVar3;
  Name local_18;
  
  if ((memoryName == (char *)0x0) &&
     (puVar1 = (module->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(module->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 8)) {
    _Var2._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (puVar1->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
    ;
    local_18.super_IString.str._M_len =
         *(size_t *)
          _Var2._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    local_18.super_IString.str._M_str =
         *(char **)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                          .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
  }
  else {
    wasm::Name::Name(&local_18,memoryName);
  }
  IVar3.str._M_str = local_18.super_IString.str._M_str;
  IVar3.str._M_len = local_18.super_IString.str._M_len;
  return (IString)(IString)IVar3.str;
}

Assistant:

static Name getMemoryName(BinaryenModuleRef module, const char* memoryName) {
  if (memoryName == nullptr && module->memories.size() == 1) {
    return module->memories[0]->name;
  }

  return memoryName;
}